

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O2

void __thiscall ConsoleTable::setStyle(ConsoleTable *this,uint n)

{
  long lVar1;
  
  lVar1 = 0x48;
  if (n - 1 < 3) {
    lVar1 = (ulong)(n - 1) * 0x160 + 0x1a8;
  }
  TableStyle::operator=
            (&this->style,
             (TableStyle *)
             ((long)&(this->headers).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar1));
  return;
}

Assistant:

void ConsoleTable::setStyle(unsigned int n) {
    switch (n) {
        case 0 :
            style = BasicStyle;
            break;
        case 1 :
            style = LineStyle;
            break;
        case 2 :
            style = DoubleLineStyle;
            break;
        case 3 :
            style = InvisibleStyle;
            break;
        default :
            style = BasicStyle;
            break;
    }
}